

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgm__load_plane_polygons(djg_mesh *mesh,int slices,int stacks)

{
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint16_t *puVar8;
  uint16_t *puVar9;
  uint16_t *puVar10;
  uint16_t *p4;
  uint16_t *p3;
  int32_t p4c;
  int32_t p3c;
  int32_t j;
  int32_t i;
  uint16_t *p4v;
  uint16_t *p3v;
  int stacks_local;
  int slices_local;
  djg_mesh *mesh_local;
  
  iVar4 = slices + 1;
  iVar5 = stacks + 1;
  iVar6 = iVar4 * iVar5 * 6;
  iVar7 = iVar4 * iVar5 * 4;
  puVar8 = (uint16_t *)malloc((long)iVar6 << 1);
  puVar9 = (uint16_t *)malloc((long)iVar7 << 1);
  for (p4c = 0; sVar3 = (short)iVar5, p4c < iVar5; p4c = p4c + 1) {
    for (p3c = 0; p3c < iVar4; p3c = p3c + 1) {
      puVar10 = puVar8 + (p4c * iVar4 + p3c) * 6;
      sVar2 = (short)p3c;
      sVar1 = (short)p4c;
      *puVar10 = sVar1 + (sVar3 + 1) * sVar2;
      puVar10[1] = sVar1 + (sVar3 + 1) * (sVar2 + 1);
      puVar10[2] = sVar1 + 1 + (sVar3 + 1) * sVar2;
      puVar10[3] = sVar1 + 1 + (sVar3 + 1) * sVar2;
      puVar10[4] = sVar1 + (sVar3 + 1) * (sVar2 + 1);
      puVar10[5] = sVar1 + 1 + (sVar3 + 1) * (sVar2 + 1);
    }
  }
  for (p4c = 0; p4c < iVar5; p4c = p4c + 1) {
    for (p3c = 0; p3c < iVar4; p3c = p3c + 1) {
      puVar10 = puVar9 + (p4c * iVar4 + p3c) * 4;
      sVar2 = (short)p3c;
      sVar1 = (short)p4c;
      *puVar10 = sVar1 + (sVar3 + 1) * sVar2;
      puVar10[1] = sVar1 + (sVar3 + 1) * (sVar2 + 1);
      puVar10[2] = sVar1 + 1 + (sVar3 + 1) * (sVar2 + 1);
      puVar10[3] = sVar1 + 1 + (sVar3 + 1) * sVar2;
    }
  }
  mesh->poly3c = iVar6;
  mesh->poly4c = iVar7;
  mesh->poly3v = puVar8;
  mesh->poly4v = puVar9;
  return true;
}

Assistant:

static bool djgm__load_plane_polygons(djg_mesh *mesh, int slices, int stacks)
{
    uint16_t *p3v, *p4v;
    int32_t i, j, p3c, p4c;

    ++slices;
    ++stacks;

    p3c = /* quad count */slices * stacks
        * /* triangles per quad */2
        * /* indexes per triangle*/3;
    p4c = /* quad count */slices * stacks
        * /* indexes per quad */4;
    p3v = (uint16_t *)DJG_MALLOC(sizeof(*p3v) * p3c);
    p4v = (uint16_t *)DJG_MALLOC(sizeof(*p4v) * p4c);

    // build triangles
    for (j = 0; j < stacks; ++j)
    for (i = 0; i < slices; ++i) {
        uint16_t *p3 = &p3v[2 * 3 * (j * slices + i)];

        // upper triangle
        p3[0] = j     + (stacks + 1) *  i;
        p3[1] = j     + (stacks + 1) * (i + 1);
        p3[2] = j + 1 + (stacks + 1) *  i;

        p3+= 3;

        // lower triangle
        p3[0] = j + 1 + (stacks + 1) *  i;
        p3[1] = j     + (stacks + 1) * (i + 1);
        p3[2] = j + 1 + (stacks + 1) * (i + 1);
    }

    // build quads
    for (j = 0; j < stacks; ++j)
    for (i = 0; i < slices; ++i) {
        uint16_t *p4 = &p4v[4 * (j * slices + i)];

        p4[0] = j     + (stacks + 1) *  i;
        p4[1] = j     + (stacks + 1) * (i + 1);
        p4[2] = j + 1 + (stacks + 1) * (i + 1);
        p4[3] = j + 1 + (stacks + 1) *  i;
    }

    mesh->poly3c = p3c;
    mesh->poly4c = p4c;
    mesh->poly3v = p3v;
    mesh->poly4v = p4v;

    return true;
}